

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPlanarActionVarying::IfcStructuralPlanarActionVarying
          (IfcStructuralPlanarActionVarying *this)

{
  IfcStructuralPlanarActionVarying *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d8,"IfcStructuralPlanarActionVarying");
  IfcStructuralPlanarAction::IfcStructuralPlanarAction
            (&this->super_IfcStructuralPlanarAction,&PTR_construction_vtable_24__00fab988);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPlanarActionVarying,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPlanarActionVarying,_2UL> *)
             &(this->super_IfcStructuralPlanarAction).field_0x1a8,
             &PTR_construction_vtable_24__00fabb10);
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject = 0xfab830;
  *(undefined8 *)&this->field_0x1d8 = 0xfab970;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xfab858;
  (this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xfab880;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xfab8a8;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    super_IfcProduct.field_0x100 = 0xfab8d0;
  *(undefined8 *)
   &(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.super_IfcStructuralActivity.
    field_0x138 = 0xfab8f8;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).super_IfcStructuralAction.field_0x178 =
       0xfab920;
  *(undefined8 *)&(this->super_IfcStructuralPlanarAction).field_0x1a8 = 0xfab948;
  STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::NotImplemented> *)
             &(this->super_IfcStructuralPlanarAction).field_0x1b8,(LazyObject *)0x0);
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_2UL,_0UL>::ListOf
            (&this->SubsequentAppliedLoads);
  return;
}

Assistant:

IfcStructuralPlanarActionVarying() : Object("IfcStructuralPlanarActionVarying") {}